

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnectionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSocketConnectionTests::TestSessionConnectionReadSocket_SocketException_ReadFailedHelper::
RunImpl(TestSessionConnectionReadSocket_SocketException_ReadFailedHelper *this)

{
  TestResults *this_00;
  byte bVar1;
  bool bVar2;
  pointer pSVar3;
  TestResults **ppTVar4;
  TestDetails **ppTVar5;
  TestDetails local_158;
  SocketConnector local_128 [8];
  SocketConnector connector;
  Session *session;
  TestSessionConnectionReadSocket_SocketException_ReadFailedHelper *this_local;
  
  TestSessionConnection::getSession(&this->super_TestSessionConnection);
  FIX::Session::disconnect();
  FIX::SocketConnector::SocketConnector(local_128,0);
  pSVar3 = std::unique_ptr<FIX::SocketConnection,_std::default_delete<FIX::SocketConnection>_>::
           operator->(&(this->super_TestSessionConnection).pSocketConnection);
  bVar1 = FIX::SocketConnection::read((SocketConnector *)pSVar3);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar1 & 1));
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_158,*ppTVar5,0x10b);
    UnitTest::TestResults::OnTestFailure(this_00,&local_158,"!pSocketConnection->read(connector)");
  }
  FIX::SocketConnector::~SocketConnector(local_128);
  return;
}

Assistant:

TEST_FIXTURE(TestSessionConnection, ReadSocket_SocketException_ReadFailed)
  {
    Session* session = getSession();
    session->disconnect();

    SocketConnector connector;
    CHECK(!pSocketConnection->read(connector));
  }